

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

symbol * Symbol_new(char *x)

{
  char *pcVar1;
  ushort *puVar2;
  char **ppcVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  symbol *psVar7;
  symbol *psVar8;
  char *pcVar9;
  ushort **ppuVar10;
  FILE *__stream;
  ulong uVar11;
  char *__ptr;
  size_t sVar12;
  long lVar13;
  long lVar14;
  rule *prVar15;
  undefined8 *puVar16;
  undefined8 *puVar17;
  long *__ptr_00;
  void *pvVar18;
  symbol *extraout_RAX;
  symbol *extraout_RAX_00;
  byte bVar19;
  byte bVar20;
  ulong uVar21;
  char *pcVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  char *pcVar26;
  char cVar27;
  byte bVar28;
  symbol *psVar29;
  ulong uVar30;
  symbol *__s;
  uint uVar31;
  size_t sVar32;
  long lVar33;
  char *pcVar34;
  char *pcVar35;
  ulong uVar36;
  bool bVar37;
  bool bVar38;
  size_t sStack_3fe8;
  int iStack_3fc0;
  char *apcStack_3f90 [8];
  char *pcStack_3f50;
  uint uStack_3f48;
  uint uStack_3f44;
  char *pcStack_3f40;
  symbol *psStack_3f38;
  undefined4 uStack_3f30;
  symbol *psStack_3f28;
  symbol *psStack_3f20;
  char *pcStack_3f18;
  uint uStack_3f10;
  long alStack_3f08 [999];
  undefined8 auStack_1fd0 [1001];
  rule *prStack_88;
  char *pcStack_80;
  symbol *psStack_78;
  int iStack_70;
  int *piStack_68;
  undefined4 uStack_60;
  int iStack_5c;
  long lStack_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  symbol *psStack_48;
  
  psVar7 = Symbol_find(x);
  psVar8 = psVar7;
  if (psVar7 == (symbol *)0x0) {
    psVar29 = (symbol *)0x1;
    psVar8 = (symbol *)calloc(1,0x60);
    if (psVar8 == (symbol *)0x0) {
      Symbol_new_cold_1();
      psStack_48 = psVar7;
      memset(&uStack_3f48,0,0x3f00);
      pcVar9 = *(char **)&psVar29[1].dtnum;
      uStack_3f30 = 0;
      pcStack_3f50 = pcVar9;
      psStack_3f38 = psVar29;
      __stream = fopen(pcVar9,"rb");
      if (__stream == (FILE *)0x0) {
        Parse_cold_11();
        psVar29 = extraout_RAX;
      }
      else {
        fseek(__stream,0,2);
        uVar11 = ftell(__stream);
        rewind(__stream);
        uVar24 = (int)uVar11 + 1;
        __ptr = (char *)malloc((long)(int)uVar24);
        if (__ptr == (char *)0x0) {
          ErrorMsg(pcVar9,0,"Can\'t allocate %d of memory to hold this file.",(ulong)uVar24);
          *(int *)&psVar29->firstset = *(int *)&psVar29->firstset + 1;
          psVar29 = extraout_RAX_00;
        }
        else {
          sVar32 = (size_t)(int)uVar11;
          sVar12 = fread(__ptr,1,sVar32,__stream);
          if (sVar12 == sVar32) {
            fclose(__stream);
            __ptr[sVar32] = '\0';
            ppcVar3 = azDefine;
            iVar6 = nDefine;
            uVar11 = (ulong)(uint)nDefine;
            lVar13 = (long)nDefine;
            pcVar9 = __ptr + 6;
            lVar33 = 0;
            uVar30 = 6;
            iVar25 = 0;
            iStack_3fc0 = 0;
            pcVar34 = __ptr + 1;
            pcVar35 = __ptr;
            do {
              cVar27 = __ptr[lVar33];
              if (cVar27 != '\n') {
                if (cVar27 == '%') {
                  pcVar22 = __ptr + lVar33;
                  if ((lVar33 == 0) || (pcVar22[-1] == '\n')) {
                    iVar5 = strncmp(pcVar22,"%endif",6);
                    if ((iVar5 == 0) &&
                       (ppuVar10 = __ctype_b_loc(),
                       (*(byte *)((long)*ppuVar10 + (long)pcVar22[6] * 2 + 1) & 0x20) != 0)) {
                      pcVar22 = pcVar35;
                      if (iVar25 == 0) {
                        iVar25 = 0;
                      }
                      else {
                        iVar25 = iVar25 + -1;
                        if (iVar25 == 0) {
                          lVar14 = (long)iStack_3fc0;
                          if (lVar14 < lVar33) {
                            do {
                              if (__ptr[lVar14] != '\n') {
                                __ptr[lVar14] = ' ';
                              }
                              lVar14 = lVar14 + 1;
                            } while (lVar33 != lVar14);
                          }
                          iVar25 = 0;
                        }
                      }
                      for (; (*pcVar22 != '\0' && (*pcVar22 != '\n')); pcVar22 = pcVar22 + 1) {
                        *pcVar22 = ' ';
                      }
                    }
                    else {
                      iVar5 = strncmp(pcVar22,"%ifdef",6);
                      if (((iVar5 == 0) &&
                          (ppuVar10 = __ctype_b_loc(),
                          (*(byte *)((long)*ppuVar10 + (long)pcVar22[6] * 2 + 1) & 0x20) != 0)) ||
                         ((iVar5 = strncmp(pcVar22,"%ifndef",7), iVar5 == 0 &&
                          (ppuVar10 = __ctype_b_loc(),
                          (*(byte *)((long)*ppuVar10 + (long)pcVar22[7] * 2 + 1) & 0x20) != 0)))) {
                        if (iVar25 == 0) {
                          ppuVar10 = __ctype_b_loc();
                          uVar21 = uVar30;
                          pcVar26 = pcVar9;
                          do {
                            pcVar1 = pcVar26 + 1;
                            pcVar26 = pcVar26 + 1;
                            uVar21 = uVar21 + 1;
                          } while ((*(byte *)((long)*ppuVar10 + (long)*pcVar1 * 2 + 1) & 0x20) != 0)
                          ;
                          cVar27 = __ptr[uVar21 & 0xffffffff];
                          bVar38 = false;
                          uVar36 = 0;
                          if (cVar27 != '\0') {
                            uVar36 = 0;
                            do {
                              if ((*(byte *)((long)*ppuVar10 + (long)cVar27 * 2 + 1) & 0x20) != 0)
                              break;
                              cVar27 = (__ptr + 1)[uVar36 + (uVar21 & 0xffffffff)];
                              uVar36 = uVar36 + 1;
                            } while (cVar27 != '\0');
                          }
                          if (iVar6 < 1) {
                            bVar37 = true;
                          }
                          else {
                            bVar38 = true;
                            uVar21 = 1;
                            do {
                              pcVar1 = ppcVar3[uVar21 - 1];
                              iVar25 = strncmp(pcVar1,pcVar26,uVar36 & 0xffffffff);
                              if ((iVar25 == 0) &&
                                 (sVar12 = strlen(pcVar1), (int)uVar36 == (int)sVar12)) {
                                bVar37 = false;
                                goto LAB_00106589;
                              }
                              bVar38 = (long)uVar21 < lVar13;
                              bVar37 = uVar21 != uVar11;
                              uVar21 = uVar21 + 1;
                            } while (bVar37);
                            bVar37 = true;
                          }
LAB_00106589:
                          if (pcVar22[3] != 'n') {
                            bVar38 = bVar37;
                          }
                          if (bVar38) {
                            iVar25 = 1;
                            iStack_3fc0 = (int)lVar33;
                          }
                          else {
                            iVar25 = 0;
                          }
                        }
                        else {
                          iVar25 = iVar25 + 1;
                        }
                        cVar27 = '%';
                        pcVar22 = pcVar34;
                        while ((cVar27 != '\0' && (cVar27 != '\n'))) {
                          pcVar22[-1] = ' ';
                          cVar27 = *pcVar22;
                          pcVar22 = pcVar22 + 1;
                        }
                      }
                    }
                  }
                }
                else if (cVar27 == '\0') goto LAB_001065db;
              }
              lVar33 = lVar33 + 1;
              pcVar35 = pcVar35 + 1;
              pcVar9 = pcVar9 + 1;
              uVar30 = uVar30 + 1;
              pcVar34 = pcVar34 + 1;
            } while( true );
          }
          ErrorMsg(pcVar9,0,"Can\'t read in all %d bytes of this file.",uVar11 & 0xffffffff);
          free(__ptr);
          *(int *)&psVar29->firstset = *(int *)&psVar29->firstset + 1;
        }
      }
      return psVar29;
    }
    pcVar9 = Strsafe(x);
    psVar8->name = pcVar9;
    ppuVar10 = __ctype_b_loc();
    psVar8->type = (uint)(((*ppuVar10)[*x] >> 8 & 1) == 0);
    psVar8->prec = -1;
    psVar8->assoc = UNK;
    Symbol_insert(psVar8,pcVar9);
  }
  psVar8->useCnt = psVar8->useCnt + 1;
  return psVar8;
LAB_001065db:
  if (iVar25 != 0) {
    Parse_cold_1();
    if (x2a != (s_x2 *)0x0) {
      return (symbol *)(ulong)(uint)x2a->count;
    }
    return (symbol *)0x0;
  }
  pcVar9 = __ptr;
  uVar24 = 1;
LAB_001065ef:
  do {
    cVar27 = *pcVar9;
    pcVar34 = pcVar9;
    while( true ) {
      if (cVar27 == '\n') {
        uVar24 = uVar24 + 1;
      }
      else if (cVar27 == '\0') {
        free(__ptr);
        psVar29->index = (undefined4)lStack_58;
        psVar29->type = lStack_58._4_4_;
        *(uint *)&psVar29->firstset = uStack_3f44;
        return (symbol *)(ulong)uStack_3f44;
      }
      ppuVar10 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar10 + (long)cVar27 * 2 + 1) & 0x20) != 0) {
        pcVar9 = pcVar34 + 1;
        goto LAB_001065ef;
      }
      pcVar35 = pcVar34;
      uVar31 = uVar24;
      if (cVar27 != '/') {
        if (cVar27 != '{') {
          if (cVar27 == '\"') {
            do {
              pcVar9 = pcVar35 + 1;
              while( true ) {
                pcVar35 = pcVar9;
                cVar27 = *pcVar35;
                if (cVar27 == '\n') break;
                pcVar9 = pcVar35 + 1;
                uStack_3f48 = uVar24;
                pcStack_3f40 = pcVar34;
                if (cVar27 == '\"') goto LAB_0010689c;
                if (cVar27 == '\0') {
                  Parse_cold_2();
                  pcVar9 = pcVar35;
                  goto LAB_0010689c;
                }
              }
              uVar31 = uVar31 + 1;
            } while( true );
          }
          goto LAB_001066e7;
        }
        bVar19 = pcVar34[1];
        pcVar9 = pcVar34 + 1;
        if (bVar19 == 0) goto LAB_00107392;
        iVar6 = 1;
        pcVar22 = pcVar34;
        goto LAB_0010677b;
      }
      if (pcVar34[1] != '/') break;
      for (pcVar34 = pcVar34 + 2; (cVar27 = *pcVar34, cVar27 != '\0' && (cVar27 != '\n'));
          pcVar34 = pcVar34 + 1) {
      }
    }
    if (pcVar34[1] != '*') {
LAB_001066e7:
      puVar2 = *ppuVar10;
      if ((puVar2[cVar27] & 8) == 0) {
        if ((cVar27 == '/') || (cVar27 == '|')) {
          if ((*(byte *)((long)puVar2 + (long)pcVar34[1] * 2 + 1) & 4) == 0) goto LAB_00106887;
          cVar27 = pcVar34[2];
          pcVar35 = pcVar34 + 2;
          while ((pcVar9 = pcVar35, uStack_3f48 = uVar24, pcStack_3f40 = pcVar34, cVar27 != '\0' &&
                 ((cVar27 == '_' || ((puVar2[cVar27] & 8) != 0))))) {
            cVar27 = pcVar35[1];
            pcVar35 = pcVar35 + 1;
          }
        }
        else if (((cVar27 == ':') && (pcVar34[1] == ':')) && (pcVar34[2] == '=')) {
          pcVar35 = pcVar34 + 3;
          pcVar9 = pcVar35;
          uStack_3f48 = uVar24;
          pcStack_3f40 = pcVar34;
        }
        else {
LAB_00106887:
          pcVar35 = pcVar34 + 1;
          pcVar9 = pcVar35;
          uStack_3f48 = uVar24;
          pcStack_3f40 = pcVar34;
        }
      }
      else {
        cVar27 = *pcVar34;
        while ((pcVar9 = pcVar35, uStack_3f48 = uVar24, pcStack_3f40 = pcVar34, cVar27 != '\0' &&
               ((cVar27 == '_' || ((puVar2[cVar27] & 8) != 0))))) {
          cVar27 = pcVar35[1];
          pcVar35 = pcVar35 + 1;
        }
      }
      goto LAB_0010689c;
    }
    cVar27 = pcVar34[2];
    if (cVar27 == '\0') {
      pcVar9 = pcVar34 + 2;
    }
    else {
      pcVar34 = pcVar34 + 3;
      do {
        pcVar9 = pcVar34;
        if (cVar27 == '\n') {
          uVar24 = uVar24 + 1;
        }
        else if ((cVar27 == '/') && (pcVar9[-2] == '*')) {
          pcVar9 = pcVar9 + -1;
          lVar13 = 1;
          goto LAB_0010675b;
        }
        cVar27 = *pcVar9;
        pcVar34 = pcVar9 + 1;
      } while (cVar27 != '\0');
    }
    lVar13 = 0;
LAB_0010675b:
    pcVar9 = pcVar9 + lVar13;
  } while( true );
LAB_0010677b:
  do {
    pcVar35 = pcVar9;
    if ((iVar6 < 2) && (bVar19 == 0x7d)) {
      pcVar9 = pcVar22 + 2;
      uStack_3f48 = uVar24;
      pcStack_3f40 = pcVar34;
      goto LAB_0010689c;
    }
    if (bVar19 < 0x2f) {
      if (bVar19 == 10) {
LAB_00106862:
        uVar31 = uVar31 + 1;
      }
      else if ((bVar19 == 0x22) || (bVar19 == 0x27)) {
        bVar20 = pcVar35[1];
        pcVar35 = pcVar35 + 1;
        if (bVar20 != 0) {
          bVar28 = 0;
          do {
            if ((bVar28 != 0x5c) && (bVar20 == bVar19)) break;
            uVar31 = uVar31 + (bVar20 == 10);
            bVar38 = bVar28 == 0x5c;
            bVar28 = bVar20;
            if (bVar38) {
              bVar28 = 0;
            }
            bVar20 = pcVar35[1];
            pcVar35 = pcVar35 + 1;
          } while (bVar20 != 0);
        }
      }
    }
    else if (bVar19 == 0x2f) {
      if (pcVar22[2] == '/') {
        for (pcVar35 = pcVar22 + 3; *pcVar35 != '\0'; pcVar35 = pcVar35 + 1) {
          if (*pcVar35 == '\n') goto LAB_00106862;
        }
      }
      else if (pcVar22[2] == '*') {
        pcVar35 = pcVar22 + 3;
        if (pcVar22[3] != '\0') {
          cVar27 = '\0';
          cVar4 = pcVar22[3];
          do {
            if (cVar27 == '*' && cVar4 == '/') break;
            uVar31 = uVar31 + (cVar4 == '\n');
            pcVar9 = pcVar35 + 1;
            pcVar35 = pcVar35 + 1;
            cVar27 = cVar4;
            cVar4 = *pcVar9;
          } while (*pcVar9 != '\0');
        }
      }
    }
    else if (bVar19 == 0x7b) {
      iVar6 = iVar6 + 1;
    }
    else if (bVar19 == 0x7d) {
      iVar6 = iVar6 + -1;
    }
    bVar19 = pcVar35[1];
    pcVar9 = pcVar35 + 1;
    pcVar22 = pcVar35;
  } while (bVar19 != 0);
LAB_00107392:
  pcVar35 = pcVar9;
  uStack_3f48 = uVar24;
  pcStack_3f40 = pcVar34;
  ErrorMsg(pcStack_3f50,uVar24,
           "C code starting on this line is not terminated before the end of the file.");
  uStack_3f44 = uStack_3f44 + 1;
  pcVar9 = pcVar35;
LAB_0010689c:
  cVar27 = *pcVar35;
  *pcVar35 = '\0';
  pcVar34 = Strsafe(pcStack_3f40);
  prVar15 = prStack_88;
  uVar24 = uStack_3f10;
  psVar8 = psStack_3f28;
  switch(uStack_3f30) {
  case 0:
    prStack_88 = (rule *)0x0;
    uStack_4c = 0;
    iStack_5c = 0;
    lStack_58 = 0;
    uStack_50 = 0;
    *(undefined4 *)((long)&psStack_3f38->rule + 4) = 0;
  case 1:
    cVar4 = *pcVar34;
    if ((long)cVar4 == 0x25) {
LAB_00106e18:
      uStack_3f30 = 2;
    }
    else if ((*(byte *)((long)*ppuVar10 + (long)cVar4 * 2 + 1) & 2) == 0) {
      if (cVar4 == '[') {
        uStack_3f30 = 0xc;
      }
      else if (cVar4 == '{') {
        if (prStack_88 == (rule *)0x0) {
          Parse_cold_10();
          psVar8 = psStack_3f28;
        }
        else if (prStack_88->code == (char *)0x0) {
          prStack_88->line = uStack_3f48;
          prStack_88->code = pcVar34 + 1;
        }
        else {
          Parse_cold_9();
          psVar8 = psStack_3f28;
        }
      }
      else {
        pcVar22 = "Token \"%s\" should be either \"%%\" or a nonterminal name.";
LAB_00107910:
        ErrorMsg(pcStack_3f50,uStack_3f48,pcVar22,pcVar34);
        uStack_3f44 = uStack_3f44 + 1;
        psVar8 = psStack_3f28;
      }
    }
    else {
      psStack_3f20 = Symbol_new(pcVar34);
      uStack_3f10 = 0;
      pcStack_3f18 = (char *)0x0;
      uStack_3f30 = 5;
      psVar8 = psStack_3f28;
    }
    goto switchD_001068d6_default;
  case 2:
    if ((*(byte *)((long)*ppuVar10 + (long)*pcVar34 * 2 + 1) & 4) != 0) {
      psStack_78 = (symbol *)0x0;
      piStack_68 = (int *)0x0;
      iStack_70 = 1;
      uStack_3f30 = 3;
      pcStack_80 = pcVar34;
      iVar6 = strcmp(pcVar34,"name");
      if (iVar6 == 0) {
        psStack_78 = (symbol *)&psStack_3f38->destLineno;
        goto LAB_001072f4;
      }
      iVar6 = strcmp(pcVar34,"include");
      if (iVar6 == 0) {
        psStack_78 = (symbol *)&psStack_3f38[1].rule;
        psVar8 = psStack_3f28;
        goto switchD_001068d6_default;
      }
      iVar6 = strcmp(pcVar34,"code");
      if (iVar6 == 0) {
        lVar13 = 0x98;
      }
      else {
        iVar6 = strcmp(pcVar34,"token_destructor");
        if (iVar6 == 0) {
          lVar13 = 0xa0;
        }
        else {
          iVar6 = strcmp(pcVar34,"default_destructor");
          if (iVar6 == 0) {
            lVar13 = 0xa8;
          }
          else {
            iVar6 = strcmp(pcVar34,"token_prefix");
            if (iVar6 == 0) {
              psStack_78 = psStack_3f38 + 2;
LAB_001072f4:
              iStack_70 = 0;
              psVar8 = psStack_3f28;
              goto switchD_001068d6_default;
            }
            iVar6 = strcmp(pcVar34,"syntax_error");
            if (iVar6 == 0) {
              psStack_78 = (symbol *)&psStack_3f38[1].fallback;
              psVar8 = psStack_3f28;
              goto switchD_001068d6_default;
            }
            iVar6 = strcmp(pcVar34,"parse_accept");
            if (iVar6 == 0) {
              lVar13 = 0x90;
            }
            else {
              iVar6 = strcmp(pcVar34,"parse_failure");
              if (iVar6 != 0) {
                iVar6 = strcmp(pcVar34,"stack_overflow");
                if (iVar6 == 0) {
                  psStack_78 = (symbol *)&psStack_3f38[1].prec;
                  psVar8 = psStack_3f28;
                  goto switchD_001068d6_default;
                }
                iVar6 = strcmp(pcVar34,"extra_argument");
                if (iVar6 == 0) {
                  psStack_78 = (symbol *)&psStack_3f38->datatype;
                }
                else {
                  iVar6 = strcmp(pcVar34,"token_type");
                  if (iVar6 == 0) {
                    psStack_78 = (symbol *)&psStack_3f38->dtnum;
                  }
                  else {
                    iVar6 = strcmp(pcVar34,"default_type");
                    if (iVar6 == 0) {
                      psStack_78 = (symbol *)&psStack_3f38->subsym;
                    }
                    else {
                      iVar6 = strcmp(pcVar34,"stack_size");
                      if (iVar6 == 0) {
                        psStack_78 = (symbol *)&psStack_3f38[1].index;
                      }
                      else {
                        iVar6 = strcmp(pcVar34,"start_symbol");
                        if (iVar6 != 0) {
                          iVar6 = strcmp(pcVar34,"left");
                          if (iVar6 == 0) {
                            iStack_5c = iStack_5c + 1;
                            uStack_60 = 0;
                          }
                          else {
                            iVar6 = strcmp(pcVar34,"right");
                            if (iVar6 == 0) {
                              iStack_5c = iStack_5c + 1;
                              uStack_60 = 1;
                            }
                            else {
                              iVar6 = strcmp(pcVar34,"nonassoc");
                              if (iVar6 != 0) {
                                iVar6 = strcmp(pcVar34,"destructor");
                                if (iVar6 == 0) {
                                  uStack_3f30 = 0x10;
                                  psVar8 = psStack_3f28;
                                  goto switchD_001068d6_default;
                                }
                                iVar6 = strcmp(pcVar34,"type");
                                if (iVar6 == 0) {
                                  uStack_3f30 = 0x11;
                                  psVar8 = psStack_3f28;
                                  goto switchD_001068d6_default;
                                }
                                iVar6 = strcmp(pcVar34,"fallback");
                                if (iVar6 == 0) {
                                  psStack_3f28 = (symbol *)0x0;
                                  uStack_3f30 = 0x12;
                                  psVar8 = psStack_3f28;
                                  goto switchD_001068d6_default;
                                }
                                iVar6 = strcmp(pcVar34,"wildcard");
                                if (iVar6 == 0) {
                                  uStack_3f30 = 0x14;
                                  psVar8 = psStack_3f28;
                                  goto switchD_001068d6_default;
                                }
                                iVar6 = strcmp(pcVar34,"expect");
                                if (iVar6 == 0) {
                                  if ((int)psStack_3f38[2].type < 0) {
                                    uStack_3f30 = 0x13;
                                    psVar8 = psStack_3f28;
                                    goto switchD_001068d6_default;
                                  }
                                  pcVar34 = "Multiple %expect declarations.";
                                  goto LAB_001076f8;
                                }
                                pcVar22 = "Unknown declaration keyword: \"%%%s\".";
                                goto LAB_001076b6;
                              }
                              iStack_5c = iStack_5c + 1;
                              uStack_60 = 2;
                            }
                          }
                          uStack_3f30 = 4;
                          psVar8 = psStack_3f28;
                          goto switchD_001068d6_default;
                        }
                        psStack_78 = psStack_3f38 + 1;
                      }
                    }
                  }
                }
                goto LAB_001072f4;
              }
              lVar13 = 0x88;
            }
          }
        }
      }
      psStack_78 = (symbol *)((long)&psStack_3f38->name + lVar13);
      psVar8 = psStack_3f28;
      goto switchD_001068d6_default;
    }
    pcVar22 = "Illegal declaration keyword: \"%s\".";
LAB_001076b6:
    ErrorMsg(pcStack_3f50,uStack_3f48,pcVar22,pcVar34);
    goto LAB_001076ff;
  case 3:
    cVar4 = *pcVar34;
    if (((cVar4 == '\"') || (cVar4 == '{')) || (((*ppuVar10)[cVar4] & 8) != 0)) {
      if ((cVar4 == '{') || (cVar4 == '\"')) {
        pcVar34 = pcVar34 + 1;
      }
      sVar12 = strlen(pcVar34);
      psVar7 = psStack_78;
      psVar8 = (symbol *)psStack_78->name;
      __s = psVar8;
      if (psVar8 == (symbol *)0x0) {
        __s = (symbol *)0x10d7bf;
      }
      sVar32 = strlen((char *)__s);
      iVar6 = (int)sVar12;
      iVar25 = (int)sVar32;
      iVar5 = iVar6 + iVar25 + 0x14;
      if ((*(int *)((long)&psStack_3f38[2].fallback + 4) == 0) && (iStack_70 != 0)) {
        if ((piStack_68 == (int *)0x0) || (*piStack_68 != 0)) {
          iVar23 = 0;
          pcVar22 = pcStack_3f50;
          do {
            if (*pcVar22 == '\\') {
              iVar23 = iVar23 + 1;
            }
            else if (*pcVar22 == '\0') goto LAB_0010727c;
            pcVar22 = pcVar22 + 1;
          } while( true );
        }
        bVar38 = false;
        sStack_3fe8 = 0;
      }
      else {
        sStack_3fe8 = 0;
        bVar38 = false;
      }
      goto LAB_00107446;
    }
    ErrorMsg(pcStack_3f50,uStack_3f48,"Illegal argument to %%%s: %s",pcStack_80,pcVar34);
    goto LAB_001076ff;
  case 4:
    if ((long)*pcVar34 == 0x2e) break;
    if ((*(byte *)((long)*ppuVar10 + (long)*pcVar34 * 2 + 1) & 1) == 0) {
      pcVar22 = "Can\'t assign a precedence to \"%s\".";
    }
    else {
      psVar8 = Symbol_new(pcVar34);
      if (psVar8->prec < 0) {
        psVar8->prec = iStack_5c;
        psVar8->assoc = uStack_60;
        psVar8 = psStack_3f28;
        goto switchD_001068d6_default;
      }
      pcVar22 = "Symbol \"%s\" has already be given a precedence.";
    }
    goto LAB_00107910;
  case 5:
    if (*pcVar34 == '(') {
      uStack_3f30 = 7;
      goto switchD_001068d6_default;
    }
    if (((*pcVar34 != ':') || (pcVar34[1] != ':')) || (pcVar34[2] != '=')) {
      pcVar34 = psStack_3f20->name;
      pcVar22 = "Expected to see a \":\" following the LHS symbol \"%s\".";
      goto LAB_0010755f;
    }
    goto LAB_00106f06;
  case 6:
    cVar4 = *pcVar34;
    if ((long)cVar4 != 0x2e) {
      if ((*(byte *)((long)*ppuVar10 + (long)cVar4 * 2 + 1) & 4) == 0) {
        if (cVar4 == '(') {
          if (0 < (int)uStack_3f10) {
            uStack_3f30 = 10;
            goto switchD_001068d6_default;
          }
        }
        else if (((cVar4 == '|') || (cVar4 == '/')) && (0 < (int)uStack_3f10)) {
          uVar24 = uStack_3f10 - 1;
          puVar16 = (undefined8 *)alStack_3f08[uVar24];
          if (*(int *)((long)puVar16 + 0xc) == 2) {
            __ptr_00 = (long *)puVar16[0xb];
            iVar6 = *(int *)((long)puVar16 + 0x54) + 1;
            puVar17 = puVar16;
          }
          else {
            puVar17 = (undefined8 *)calloc(1,0x60);
            *(undefined4 *)((long)puVar17 + 0xc) = 2;
            *(undefined4 *)((long)puVar17 + 0x54) = 1;
            __ptr_00 = (long *)calloc(1,8);
            puVar17[0xb] = __ptr_00;
            *__ptr_00 = (long)puVar16;
            *puVar17 = *puVar16;
            alStack_3f08[uVar24] = (long)puVar17;
            iVar6 = 2;
          }
          *(int *)((long)puVar17 + 0x54) = iVar6;
          pvVar18 = realloc(__ptr_00,(long)iVar6 << 3);
          puVar17[0xb] = pvVar18;
          psVar8 = Symbol_new(pcVar34 + 1);
          *(symbol **)(puVar17[0xb] + -8 + (long)*(int *)((long)puVar17 + 0x54) * 8) = psVar8;
          if (((*(byte *)((long)*ppuVar10 + (long)pcVar34[1] * 2 + 1) & 2) != 0) ||
             (psVar8 = psStack_3f28,
             (*(byte *)((long)*ppuVar10 + (long)*(char *)**(undefined8 **)puVar17[0xb] * 2 + 1) & 2)
             != 0)) {
            Parse_cold_4();
            psVar8 = psStack_3f28;
          }
          goto switchD_001068d6_default;
        }
        pcVar22 = "Illegal character on RHS of rule: \"%s\".";
      }
      else {
        lVar13 = (long)(int)uStack_3f10;
        if (lVar13 < 1000) {
          psVar8 = Symbol_new(pcVar34);
          alStack_3f08[lVar13] = (long)psVar8;
          auStack_1fd0[lVar13 + 1] = 0;
          uStack_3f10 = uVar24 + 1;
          psVar8 = psStack_3f28;
          goto switchD_001068d6_default;
        }
        pcVar22 = "Too many symbols on RHS of rule beginning at \"%s\".";
      }
      goto LAB_0010755f;
    }
    uVar11 = (ulong)uStack_3f10;
    lVar13 = (long)(int)uStack_3f10;
    prVar15 = (rule *)calloc(lVar13 * 0x10 + 0x60,1);
    if (prVar15 == (rule *)0x0) {
      Parse_cold_5();
      prStack_88 = prVar15;
    }
    else {
      prVar15->ruleline = uStack_3f48;
      prVar15->rhs = &prVar15[1].lhs;
      prVar15->rhsalias = (char **)(&prVar15[1].lhs + lVar13);
      if (0 < (int)uVar24) {
        uVar30 = 0;
        do {
          prVar15->rhs[uVar30] = (symbol *)alStack_3f08[uVar30];
          prVar15->rhsalias[uVar30] = (char *)auStack_1fd0[uVar30 + 1];
          uVar30 = uVar30 + 1;
        } while (uVar11 != uVar30);
      }
      prVar15->lhs = psStack_3f20;
      prVar15->lhsalias = pcStack_3f18;
      prVar15->nrhs = uVar24;
      prVar15->code = (char *)0x0;
      prVar15->precsym = (symbol *)0x0;
      iVar6 = *(int *)((long)&psStack_3f38->rule + 4);
      *(int *)((long)&psStack_3f38->rule + 4) = iVar6 + 1;
      prVar15->index = iVar6;
      prVar15->nextlhs = psStack_3f20->rule;
      psStack_3f20->rule = prVar15;
      prVar15->next = (rule *)0x0;
      puVar16 = (undefined8 *)(CONCAT44(uStack_4c,uStack_50) + 0x58);
      if (lStack_58 == 0) {
        puVar16 = (undefined8 *)&uStack_50;
      }
      *puVar16 = prVar15;
      (&lStack_58)[lStack_58 != 0] = (long)prVar15;
      prStack_88 = prVar15;
    }
    break;
  case 7:
    if ((*(byte *)((long)*ppuVar10 + (long)*pcVar34 * 2 + 1) & 4) != 0) {
      uStack_3f30 = 8;
      pcStack_3f18 = pcVar34;
      goto switchD_001068d6_default;
    }
    pcVar22 = psStack_3f20->name;
    pcVar26 = "\"%s\" is not a valid alias for the LHS \"%s\"\n";
    goto LAB_00107742;
  case 8:
    if (*pcVar34 == ')') {
      uStack_3f30 = 9;
      goto switchD_001068d6_default;
    }
LAB_00107407:
    pcVar22 = "Missing \")\" following LHS alias name \"%s\".";
    pcVar34 = pcStack_3f18;
LAB_0010755f:
    ErrorMsg(pcStack_3f50,uStack_3f48,pcVar22,pcVar34);
    goto LAB_00107749;
  case 9:
    if (((*pcVar34 != ':') || (pcVar34[1] != ':')) || (pcVar34[2] != '=')) {
      pcVar34 = psStack_3f20->name;
      pcVar26 = "Missing \"->\" following: \"%s(%s)\".";
      pcVar22 = pcStack_3f18;
      goto LAB_00107742;
    }
    goto LAB_00106f06;
  case 10:
    if ((*(byte *)((long)*ppuVar10 + (long)*pcVar34 * 2 + 1) & 4) != 0) {
      auStack_1fd0[(int)uStack_3f10] = pcVar34;
      uStack_3f30 = 0xb;
      goto switchD_001068d6_default;
    }
    pcVar22 = *(char **)alStack_3f08[(long)(int)uStack_3f10 + -1];
    pcVar26 = "\"%s\" is not a valid alias for the RHS symbol \"%s\"\n";
LAB_00107742:
    ErrorMsg(pcStack_3f50,uStack_3f48,pcVar26,pcVar34,pcVar22);
LAB_00107749:
    uStack_3f44 = uStack_3f44 + 1;
    uStack_3f30 = 0xe;
    psVar8 = psStack_3f28;
    goto switchD_001068d6_default;
  case 0xb:
    if (*pcVar34 != ')') goto LAB_00107407;
LAB_00106f06:
    uStack_3f30 = 6;
    goto switchD_001068d6_default;
  case 0xc:
    if ((*(byte *)((long)*ppuVar10 + (long)*pcVar34 * 2 + 1) & 1) == 0) {
      Parse_cold_8();
    }
    else if (prStack_88 == (rule *)0x0) {
      ErrorMsg(pcStack_3f50,uStack_3f48,"There is no prior rule to assign precedence \"[%s]\".");
      uStack_3f44 = uStack_3f44 + 1;
    }
    else if (prStack_88->precsym == (symbol *)0x0) {
      psVar8 = Symbol_new(pcVar34);
      prVar15->precsym = psVar8;
    }
    else {
      Parse_cold_7();
    }
    uStack_3f30 = 0xd;
    psVar8 = psStack_3f28;
    goto switchD_001068d6_default;
  case 0xd:
    if (*pcVar34 != ']') {
      Parse_cold_6();
    }
    break;
  case 0xe:
  case 0xf:
    cVar4 = *pcVar34;
    if (cVar4 == '.') {
      uStack_3f30 = 1;
      cVar4 = *pcVar34;
    }
    if (cVar4 != '%') goto switchD_001068d6_default;
    goto LAB_00106e18;
  case 0x10:
    if ((*(byte *)((long)*ppuVar10 + (long)*pcVar34 * 2 + 1) & 4) != 0) {
      psVar8 = Symbol_new(pcVar34);
      psStack_78 = (symbol *)&psVar8->destructor;
      piStack_68 = &psVar8->destLineno;
      iStack_70 = 1;
      uStack_3f30 = 3;
      psVar8 = psStack_3f28;
      goto switchD_001068d6_default;
    }
    pcVar34 = "Symbol name missing after %%destructor keyword";
    goto LAB_001076f8;
  case 0x11:
    if ((*(byte *)((long)*ppuVar10 + (long)*pcVar34 * 2 + 1) & 4) != 0) {
      psVar8 = Symbol_find(pcVar34);
      if (psVar8 == (symbol *)0x0) {
        psVar8 = Symbol_new(pcVar34);
      }
      else if (psVar8->datatype != (char *)0x0) {
        ErrorMsg(pcStack_3f50,uStack_3f48,"Symbol %%type \"%s\" already defined",pcVar34);
        uStack_3f44 = uStack_3f44 + 1;
        uStack_3f30 = 0xf;
        psVar8 = psStack_3f28;
        goto switchD_001068d6_default;
      }
      psStack_78 = (symbol *)&psVar8->datatype;
      iStack_70 = 0;
      uStack_3f30 = 3;
      psVar8 = psStack_3f28;
      goto switchD_001068d6_default;
    }
    pcVar34 = "Symbol name missing after %%type keyword";
LAB_001076f8:
    ErrorMsg(pcStack_3f50,uStack_3f48,pcVar34);
LAB_001076ff:
    uStack_3f44 = uStack_3f44 + 1;
    uStack_3f30 = 0xf;
    psVar8 = psStack_3f28;
    goto switchD_001068d6_default;
  case 0x12:
    if ((long)*pcVar34 != 0x2e) {
      if ((*(byte *)((long)*ppuVar10 + (long)*pcVar34 * 2 + 1) & 1) == 0) {
        pcVar22 = "%%fallback argument \"%s\" should be a token";
      }
      else {
        psVar8 = Symbol_new(pcVar34);
        if (psStack_3f28 == (symbol *)0x0) goto switchD_001068d6_default;
        if (psVar8->fallback == (symbol *)0x0) {
          psVar8->fallback = psStack_3f28;
          *(undefined4 *)&psStack_3f38[2].fallback = 1;
          psVar8 = psStack_3f28;
          goto switchD_001068d6_default;
        }
        pcVar22 = "More than one fallback assigned to token %s";
      }
      goto LAB_00107910;
    }
    break;
  case 0x13:
    lVar13 = strtol(pcVar34,apcStack_3f90,10);
    psStack_3f38[2].type = (symbol_type)lVar13;
    if (((apcStack_3f90[0] == pcVar34) || (*apcStack_3f90[0] != '\0')) ||
       ((int)(symbol_type)lVar13 < 0)) {
      Parse_cold_3();
    }
    break;
  case 0x14:
    if ((long)*pcVar34 != 0x2e) {
      if ((*(byte *)((long)*ppuVar10 + (long)*pcVar34 * 2 + 1) & 1) == 0) {
        pcVar22 = "%%wildcard argument \"%s\" should be a token";
      }
      else {
        psVar8 = Symbol_new(pcVar34);
        if (psStack_3f38->destructor == (char *)0x0) {
          psStack_3f38->destructor = (char *)psVar8;
          psVar8 = psStack_3f28;
          goto switchD_001068d6_default;
        }
        pcVar22 = "Extra wildcard to token: %s";
      }
      goto LAB_00107910;
    }
    break;
  default:
    goto switchD_001068d6_default;
  }
LAB_00107515:
  uStack_3f30 = 1;
  psVar8 = psStack_3f28;
switchD_001068d6_default:
  psStack_3f28 = psVar8;
  *pcVar35 = cVar27;
  uVar24 = uVar31;
  goto LAB_001065ef;
LAB_0010727c:
  sprintf((char *)apcStack_3f90,"#line %d ",(ulong)uStack_3f48);
  sVar12 = strlen((char *)apcStack_3f90);
  sVar32 = strlen(pcStack_3f50);
  iVar5 = iVar23 + iVar5 + (int)sVar12 + (int)sVar32;
  sStack_3fe8 = (size_t)(int)sVar12;
  psVar8 = (symbol *)psStack_78->name;
  bVar38 = true;
  psVar7 = psStack_78;
LAB_00107446:
  psVar8 = (symbol *)realloc(psVar8,(long)iVar5);
  psVar7->name = (char *)psVar8;
  pcVar22 = (char *)((long)&((symbol *)psStack_78->name)->name + (long)iVar25);
  if (bVar38) {
    if ((iVar25 != 0) && (pcVar22[-1] != '\n')) {
      *pcVar22 = '\n';
      pcVar22 = pcVar22 + 1;
    }
    memcpy(pcVar22,apcStack_3f90,sStack_3fe8);
    pcVar26 = pcVar22 + sStack_3fe8;
    pcVar22[sStack_3fe8] = '\"';
    pcVar22 = pcStack_3f50;
    do {
      cVar4 = *pcVar22;
      if (cVar4 == '\\') {
        pcVar26[1] = '\\';
        pcVar26 = pcVar26 + 2;
        cVar4 = *pcVar22;
      }
      else {
        if (cVar4 == '\0') goto LAB_001074d5;
        pcVar26 = pcVar26 + 1;
      }
      *pcVar26 = cVar4;
      pcVar22 = pcVar22 + 1;
    } while( true );
  }
  goto LAB_001074e2;
LAB_001074d5:
  pcVar26[1] = '\"';
  pcVar26[2] = '\n';
  pcVar22 = pcVar26 + 3;
LAB_001074e2:
  if ((piStack_68 != (int *)0x0) && (*piStack_68 == 0)) {
    *piStack_68 = uStack_3f48;
  }
  memcpy(pcVar22,pcVar34,(long)iVar6);
  pcVar22[iVar6] = '\0';
  goto LAB_00107515;
}

Assistant:

struct symbol *Symbol_new(const char *x)
{
  struct symbol *sp;

  sp = Symbol_find(x);
  if( sp==0 ){
    sp = (struct symbol *)calloc(1, sizeof(struct symbol) );
    MemoryCheck(sp);
    sp->name = Strsafe(x);
    sp->type = isupper(*x) ? TERMINAL : NONTERMINAL;
    sp->rule = 0;
    sp->fallback = 0;
    sp->prec = -1;
    sp->assoc = UNK;
    sp->firstset = 0;
    sp->lambda = LEMON_FALSE;
    sp->destructor = 0;
    sp->destLineno = 0;
    sp->datatype = 0;
    sp->useCnt = 0;
    Symbol_insert(sp,sp->name);
  }
  sp->useCnt++;
  return sp;
}